

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall
llm_tokenizer_rwkv_session::tokenize
          (llm_tokenizer_rwkv_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  undefined8 in_RAX;
  naive_trie *this_00;
  ulong uVar1;
  llama_token lVar2;
  ulong uVar3;
  undefined8 local_38;
  
  uVar1 = 0;
  local_38 = in_RAX;
  while (uVar1 < text->_M_string_length) {
    this_00 = naive_trie::traverse(&this->tokenizer->token_matcher,(text->_M_dataplus)._M_p[uVar1]);
    if (this_00 == (naive_trie *)0x0) {
      local_38 = CONCAT44(*(undefined4 *)
                           ((long)(this->vocab->pimpl)._M_t.
                                  super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                                  .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20),
                          (int)local_38);
      llama_vocab::std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (output,(int *)((long)&local_38 + 4));
      uVar1 = (ulong)((int)uVar1 + 1);
    }
    else {
      lVar2 = 0;
      uVar3 = 0;
      for (; this_00 != (naive_trie *)0x0;
          this_00 = naive_trie::traverse(this_00,(text->_M_dataplus)._M_p[uVar1])) {
        if (this_00->has_value != false) {
          lVar2 = this_00->value;
          uVar3 = (ulong)((int)uVar1 + 1);
        }
        uVar1 = (ulong)((int)uVar1 + 1);
      }
      local_38 = CONCAT44(local_38._4_4_,lVar2);
      llama_vocab::std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (output,(int *)&local_38);
      uVar1 = uVar3;
    }
  }
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        uint32_t position = 0;
        while (position < text.size()) {
            const struct naive_trie * node = tokenizer.token_matcher.traverse(text[position]);
            if (node == NULL) {
                // no matching token found, add unknown token
                output.push_back(vocab.token_unk());
                position += 1;
                continue;
            }

            // traverse the trie to find the longest matching token
            uint32_t token_id = 0;
            uint32_t token_length = 0;
            while (node != NULL) {
                if (node->has_value) {
                    token_id = node->value;
                    token_length = position + 1;
                }
                node = node->traverse(text[++position]);
            }

            // add the longest matching token
            output.push_back(token_id);
            position = token_length;
        }
    }